

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O0

matrix2d * __thiscall tinyusdz::value::matrix2d::operator=(matrix2d *this,matrix2f *src)

{
  ulong local_28;
  size_t i;
  size_t j;
  matrix2f *src_local;
  matrix2d *this_local;
  
  for (i = 0; i < 2; i = i + 1) {
    for (local_28 = 0; local_28 < 2; local_28 = local_28 + 1) {
      this->m[i][local_28] = (double)src->m[i][local_28];
    }
  }
  return this;
}

Assistant:

matrix2d &matrix2d::operator=(const matrix2f &src) {

  for (size_t j = 0; j < 2; j++) {
    for (size_t i = 0; i < 2; i++) {
      m[j][i] = double(src.m[j][i]);
    }
  }

  return *this;
}